

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

NaVector * __thiscall NaDynAr<NaVector>::fetch(NaDynAr<NaVector> *this,int index)

{
  item *piVar1;
  undefined4 *puVar2;
  int in_ESI;
  NaDynAr<NaVector> *in_RDI;
  item *p;
  
  piVar1 = fetch_item(in_RDI,in_ESI);
  if (piVar1 == (item *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 1;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  if (piVar1->pData == (NaVector *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  return piVar1->pData;
}

Assistant:

virtual type&	fetch (int index) {
    item	*p = fetch_item(index);

    if(NULL == p)
      throw(na_out_of_range);
    if(NULL == p->pData)
      throw(na_null_pointer);

    return *(p->pData);
  }